

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
Centaurus::NFA<wchar_t>::epsilon_closure
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,NFA<wchar_t> *this
          ,set<int,_std::less<int>,_std::allocator<int>_> *indices,bool *long_flag)

{
  bool bVar1;
  reference piVar2;
  iterator iStack_48;
  int index;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  bool *long_flag_local;
  set<int,_std::less<int>,_std::allocator<int>_> *indices_local;
  NFA<wchar_t> *this_local;
  set<int,_std::less<int>,_std::allocator<int>_> *ret;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(__return_storage_ptr__);
  __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(indices);
  iStack_48 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(indices);
  while (bVar1 = std::operator!=(&__end2,&stack0xffffffffffffffb8), bVar1) {
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
    bVar1 = epsilon_closure_sub(this,__return_storage_ptr__,*piVar2);
    *long_flag = (*long_flag & 1U) != 0 || bVar1;
    std::_Rb_tree_const_iterator<int>::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<int> epsilon_closure(const std::set<int>& indices, bool& long_flag) const
    {
        std::set<int> ret;

        for (int index : indices)
        {
            long_flag |= epsilon_closure_sub(ret, index);
        }

        return ret;
    }